

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O0

void __thiscall
fasttext::ProductQuantizer::MStep
          (ProductQuantizer *this,real *x0,real *centroids,uint8_t *codes,int32_t d,int32_t n)

{
  byte bVar1;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar2;
  int iVar3;
  long in_RCX;
  void *in_RDX;
  long lVar4;
  long in_RSI;
  size_type in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  int32_t sign;
  int j_2;
  int32_t m;
  int k_2;
  uniform_real_distribution<double> runiform;
  int j_1;
  real z;
  int k_1;
  real *c;
  int j;
  real *c_1;
  uint8_t k;
  int i;
  real *x;
  vector<int,_std::allocator<int>_> nelts;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  value_type in_stack_ffffffffffffff24;
  allocator_type *in_stack_ffffffffffffff28;
  double dVar8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_8c;
  int local_84;
  void *local_80;
  int local_74;
  int local_64;
  long local_60;
  vector<int,_std::allocator<int>_> local_40;
  int local_28;
  int local_24;
  long local_20;
  void *local_18;
  long local_10;
  
  this_00 = (vector<int,_std::allocator<int>_> *)(long)*(int *)(in_RDI + 4);
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<int>::allocator((allocator<int> *)0x189fea);
  std::vector<int,_std::allocator<int>_>::vector
            (this_00,in_RDI,(value_type_conflict *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  std::allocator<int>::~allocator((allocator<int> *)0x18a018);
  memset(local_18,0,(long)local_24 * 4 * (long)*(int *)(in_RDI + 4));
  local_60 = local_10;
  for (local_64 = 0; local_64 < local_28; local_64 = local_64 + 1) {
    bVar1 = *(byte *)(local_20 + local_64);
    iVar3 = (uint)bVar1 * local_24;
    for (local_74 = 0; local_74 < local_24; local_74 = local_74 + 1) {
      *(float *)((long)local_18 + (long)local_74 * 4 + (long)iVar3 * 4) =
           *(float *)(local_60 + (long)local_74 * 4) +
           *(float *)((long)local_18 + (long)local_74 * 4 + (long)iVar3 * 4);
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(ulong)bVar1);
    *pvVar2 = *pvVar2 + 1;
    local_60 = local_60 + (long)local_24 * 4;
  }
  local_80 = local_18;
  for (local_84 = 0; local_84 < *(int *)(in_RDI + 4); local_84 = local_84 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_84);
    fVar5 = (float)*pvVar2;
    if ((fVar5 != 0.0) || (NAN(fVar5))) {
      for (local_8c = 0; local_8c < local_24; local_8c = local_8c + 1) {
        *(float *)((long)local_80 + (long)local_8c * 4) =
             *(float *)((long)local_80 + (long)local_8c * 4) / fVar5;
      }
    }
    local_80 = (void *)((long)local_80 + (long)local_24 * 4);
  }
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (double)in_stack_ffffffffffffff18,7.97626001499504e-318);
  for (local_a4 = 0; local_a4 < *(int *)(in_RDI + 4); local_a4 = local_a4 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_a4);
    if (*pvVar2 == 0) {
      local_a8 = 0;
      while( true ) {
        in_stack_ffffffffffffff30 =
             (vector<int,_std::allocator<int>_> *)
             std::uniform_real_distribution<double>::operator()
                       ((uniform_real_distribution<double> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
        dVar8 = (double)in_stack_ffffffffffffff30 * (double)(local_28 - *(int *)(in_RDI + 4));
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_a8);
        auVar6 = ZEXT864((ulong)dVar8);
        if (dVar8 < (double)(*pvVar2 + -1)) break;
        local_a8 = (local_a8 + 1) % *(int *)(in_RDI + 4);
      }
      memcpy((void *)((long)local_18 + (long)(local_a4 * local_24) * 4),
             (void *)((long)local_18 + (long)(local_a8 * local_24) * 4),(long)local_24 << 2);
      for (local_ac = 0; local_ac < local_24; local_ac = local_ac + 1) {
        iVar3 = (local_ac % 2) * 2 + -1;
        auVar7._0_4_ = (float)iVar3;
        auVar7._4_12_ = auVar6._4_12_;
        lVar4 = (long)(local_a4 * local_24 + local_ac);
        auVar7 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + 0x18)),auVar7,
                                 ZEXT416(*(uint *)((long)local_18 + lVar4 * 4)));
        *(int *)((long)local_18 + lVar4 * 4) = auVar7._0_4_;
        lVar4 = (long)(local_a8 * local_24 + local_ac);
        auVar7 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + 0x18)),ZEXT416((uint)-(float)iVar3),
                                 ZEXT416(*(uint *)((long)local_18 + lVar4 * 4)));
        auVar6 = ZEXT1664(auVar7);
        *(int *)((long)local_18 + lVar4 * 4) = auVar7._0_4_;
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_a8);
      in_stack_ffffffffffffff20 = *pvVar2 / 2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_a4);
      *pvVar2 = in_stack_ffffffffffffff20;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_a4);
      in_stack_ffffffffffffff24 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_a8);
      *pvVar2 = *pvVar2 - in_stack_ffffffffffffff24;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff30);
  return;
}

Assistant:

void ProductQuantizer::MStep(const real* x0, real* centroids,
                             const uint8_t* codes,
                             int32_t d, int32_t n) {
  std::vector<int32_t> nelts(ksub_, 0);
  memset(centroids, 0, sizeof(real) * d * ksub_);
  const real* x = x0;
  for (auto i = 0; i < n; i++) {
    auto k = codes[i];
    real* c = centroids + k * d;
    for (auto j = 0; j < d; j++) {
      c[j] += x[j];
    }
    nelts[k]++;
    x += d;
  }

  real* c = centroids;
  for (auto k = 0; k < ksub_; k++) {
    real z = (real) nelts[k];
    if (z != 0) {
      for (auto j = 0; j < d; j++) {
        c[j] /= z;
      }
    }
    c += d;
  }

  std::uniform_real_distribution<> runiform(0,1);
  for (auto k = 0; k < ksub_; k++) {
    if (nelts[k] == 0) {
      int32_t m = 0;
      while (runiform(rng) * (n - ksub_) >= nelts[m] - 1) {
        m = (m + 1) % ksub_;
      }
      memcpy(centroids + k * d, centroids + m * d, sizeof(real) * d);
      for (auto j = 0; j < d; j++) {
        int32_t sign = (j % 2) * 2 - 1;
        centroids[k * d + j] += sign * eps_;
        centroids[m * d + j] -= sign * eps_;
      }
      nelts[k] = nelts[m] / 2;
      nelts[m] -= nelts[k];
    }
  }
}